

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::MergePartialFromCodedStream
          (UniDirectionalLSTMLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint32 uVar7;
  Type *this_00;
  unsigned_long uVar8;
  LSTMParams *this_01;
  uint8 *puVar9;
  LSTMWeightParams *this_02;
  pair<int,_int> pVar10;
  char cVar11;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  
LAB_0021c88b:
  pbVar3 = input->buffer_;
  uVar7 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar12 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar5 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar7 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
      goto LAB_0021cb95;
      uVar12 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar12 = uVar12 | 0x100000000;
  }
  else {
LAB_0021cb95:
    uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
    uVar12 = 0;
    if (uVar7 - 1 < 0x3fff) {
      uVar12 = 0x100000000;
    }
    uVar12 = uVar7 | uVar12;
  }
  uVar7 = (uint32)uVar12;
  if ((uVar12 & 0x100000000) == 0) goto LAB_0021c8e8;
  uVar5 = (uint)(uVar12 >> 3) & 0x1fffffff;
  cVar11 = (char)uVar12;
  if (uVar5 < 0xf) {
    if (uVar5 == 1) {
      if (cVar11 != '\b') goto LAB_0021c8e8;
      puVar9 = input->buffer_;
      if ((puVar9 < input->buffer_end_) && (-1 < (long)(char)*puVar9)) {
        this->inputvectorsize_ = (long)(char)*puVar9;
        goto LAB_0021ca53;
      }
      pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      this->inputvectorsize_ = pVar13.first;
LAB_0021cb1b:
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
      goto LAB_0021c88b;
    }
    if (uVar5 == 2) {
      if (cVar11 == '\x10') {
        puVar9 = input->buffer_;
        if ((input->buffer_end_ <= puVar9) || ((long)(char)*puVar9 < 0)) {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->outputvectorsize_ = pVar13.first;
          goto LAB_0021cb1b;
        }
        this->outputvectorsize_ = (long)(char)*puVar9;
LAB_0021ca53:
        input->buffer_ = puVar9 + 1;
        goto LAB_0021c88b;
      }
    }
    else if ((uVar5 == 10) && (cVar11 == 'R')) {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                          (&(this->activations_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar9 = input->buffer_;
      if ((puVar9 < input->buffer_end_) && (iVar6 = (int)(char)*puVar9, -1 < iVar6)) {
        input->buffer_ = puVar9 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar6);
      if ((long)pVar10 < 0) {
        return false;
      }
      bVar4 = ActivationParams::MergePartialFromCodedStream(this_00,input);
      goto LAB_0021cb81;
    }
  }
  else {
    if (uVar5 == 0xf) {
      if (cVar11 != 'z') goto LAB_0021c8e8;
      this_01 = this->params_;
      if (this_01 == (LSTMParams *)0x0) {
        this_01 = (LSTMParams *)operator_new(0x20);
        LSTMParams::LSTMParams(this_01);
        this->params_ = this_01;
      }
      puVar9 = input->buffer_;
      if ((puVar9 < input->buffer_end_) && (iVar6 = (int)(char)*puVar9, -1 < iVar6)) {
        input->buffer_ = puVar9 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar6);
      if ((long)pVar10 < 0) {
        return false;
      }
      bVar4 = LSTMParams::MergePartialFromCodedStream(this_01,input);
LAB_0021cb81:
      if (bVar4 == false) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar10.first);
LAB_0021c908:
      if (bVar4 == false) {
        return false;
      }
      goto LAB_0021c88b;
    }
    if (uVar5 == 0x14) {
      if (cVar11 == -0x5e) {
        this_02 = this->weightparams_;
        if (this_02 == (LSTMWeightParams *)0x0) {
          this_02 = (LSTMWeightParams *)operator_new(0x90);
          LSTMWeightParams::LSTMWeightParams(this_02);
          this->weightparams_ = this_02;
        }
        puVar9 = input->buffer_;
        if ((puVar9 < input->buffer_end_) && (iVar6 = (int)(char)*puVar9, -1 < iVar6)) {
          input->buffer_ = puVar9 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar6);
        if ((long)pVar10 < 0) {
          return false;
        }
        bVar4 = LSTMWeightParams::MergePartialFromCodedStream(this_02,input);
        goto LAB_0021cb81;
      }
      goto LAB_0021c8e8;
    }
    if ((uVar5 == 100) && (cVar11 == ' ')) {
      puVar9 = input->buffer_;
      if ((puVar9 < input->buffer_end_) && (uVar8 = (unsigned_long)(char)*puVar9, -1 < (long)uVar8))
      {
        input->buffer_ = puVar9 + 1;
      }
      else {
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar8 = pVar13.first;
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->reverseinput_ = uVar8 != 0;
      goto LAB_0021c88b;
    }
  }
LAB_0021c8e8:
  if (uVar7 == 0) {
    return true;
  }
  if ((uVar7 & 7) == 4) {
    return true;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
  goto LAB_0021c908;
}

Assistant:

bool UniDirectionalLSTMLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 inputVectorSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &inputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 outputVectorSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.ActivationParams activations = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_activations()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LSTMParams params = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_params()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LSTMWeightParams weightParams = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weightparams()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool reverseInput = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(800u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &reverseinput_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.UniDirectionalLSTMLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.UniDirectionalLSTMLayerParams)
  return false;
#undef DO_
}